

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4_stream.cpp
# Opt level: O1

void __thiscall minibag::LZ4Stream::writeStream(LZ4Stream *this,int action)

{
  char *__ptr;
  int iVar1;
  FILE *__s;
  size_t sVar2;
  runtime_error *prVar3;
  uint uVar4;
  ulong __n;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  if ((this->lz4s_).input_left < 1 && action != 1) {
    return;
  }
LAB_0012bb0e:
  iVar1 = roslz4_compress(&this->lz4s_,action);
  switch(iVar1) {
  case 0:
  case 2:
    goto switchD_0012bb37_caseD_0;
  case -4:
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,"ROSLZ4_PARAM_ERROR: bad block size","");
    std::runtime_error::runtime_error(prVar3,(string *)local_50);
    *(undefined ***)prVar3 = &PTR__runtime_error_001506c8;
    __cxa_throw(prVar3,&BagIOException::typeinfo,std::runtime_error::~runtime_error);
  default:
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"Unhandled return code","");
    std::runtime_error::runtime_error(prVar3,(string *)local_50);
    *(undefined ***)prVar3 = &PTR__runtime_error_001506a0;
    __cxa_throw(prVar3,&BagException::typeinfo,std::runtime_error::~runtime_error);
  case -2:
    break;
  case -1:
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,"ROSLZ4_ERROR: compression error","");
    std::runtime_error::runtime_error(prVar3,(string *)local_50);
    *(undefined ***)prVar3 = &PTR__runtime_error_001506c8;
    __cxa_throw(prVar3,&BagIOException::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((long)(this->lz4s_).output_next - (long)this->buff_ == (long)this->buff_size_) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,"ROSLZ4_OUTPUT_SMALL: output buffer is too small","");
    std::runtime_error::runtime_error(prVar3,(string *)local_50);
    *(undefined ***)prVar3 = &PTR__runtime_error_001506c8;
    __cxa_throw(prVar3,&BagIOException::typeinfo,std::runtime_error::~runtime_error);
  }
switchD_0012bb37_caseD_0:
  __ptr = this->buff_;
  uVar4 = (int)(this->lz4s_).output_next - (int)__ptr;
  if (0 < (int)uVar4) {
    __n = (ulong)(uVar4 & 0x7fffffff);
    __s = (FILE *)Stream::getFilePointer(&this->super_Stream);
    sVar2 = fwrite(__ptr,1,__n,__s);
    if (sVar2 != __n) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Problem writing data to disk","");
      std::runtime_error::runtime_error(prVar3,(string *)local_50);
      *(undefined ***)prVar3 = &PTR__runtime_error_001506a0;
      __cxa_throw(prVar3,&BagException::typeinfo,std::runtime_error::~runtime_error);
    }
    Stream::advanceOffset(&this->super_Stream,__n);
    (this->lz4s_).output_next = this->buff_;
    (this->lz4s_).output_left = this->buff_size_;
  }
  if (((this->lz4s_).input_left < 1) && (action != 1 || iVar1 == 2)) {
    return;
  }
  goto LAB_0012bb0e;
}

Assistant:

void LZ4Stream::writeStream(int action) {
    int ret = ROSLZ4_OK;
    while (lz4s_.input_left > 0 ||
           (action == ROSLZ4_FINISH && ret != ROSLZ4_STREAM_END)) {
        ret = roslz4_compress(&lz4s_, action);
        switch(ret) {
        case ROSLZ4_OK: break;
        case ROSLZ4_OUTPUT_SMALL:
            if (lz4s_.output_next - buff_ == buff_size_) {
                throw BagIOException("ROSLZ4_OUTPUT_SMALL: output buffer is too small");
            } else {
                // There's data to be written in buff_; this will free up space
                break;
            }
        case ROSLZ4_STREAM_END: break;
        case ROSLZ4_PARAM_ERROR: throw BagIOException("ROSLZ4_PARAM_ERROR: bad block size"); break;
        case ROSLZ4_ERROR: throw BagIOException("ROSLZ4_ERROR: compression error"); break;
        default: throw BagException("Unhandled return code");
        }

        // If output data is ready, write to disk
        int to_write = lz4s_.output_next - buff_;
        if (to_write > 0) {
            if (fwrite(buff_, 1, to_write, getFilePointer()) != static_cast<size_t>(to_write)) {
                throw BagException("Problem writing data to disk");
            }
            advanceOffset(to_write);
            lz4s_.output_next = buff_;
            lz4s_.output_left = buff_size_;
        }
    }
}